

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O1

void __thiscall
quic::Bbr2ProbeBwMode::UpdateProbeDown
          (Bbr2ProbeBwMode *this,QuicByteCount prior_in_flight,Bbr2CongestionEvent *congestion_event
          )

{
  Bbr2NetworkModel *pBVar1;
  bool bVar2;
  QuicByteCount QVar3;
  long lVar4;
  long lVar5;
  QuicTime now;
  
  if (((this->cycle_).rounds_in_phase == 1) && (congestion_event->end_of_round_trip == true)) {
    (this->cycle_).is_sample_from_probing = false;
    if (congestion_event->last_sample_is_app_limited == false) {
      pBVar1 = (this->super_Bbr2ModeBase).model_;
      lVar4 = (pBVar1->max_bandwidth_filter_).max_bandwidth_[1].bits_per_second_;
      if (lVar4 != 0) {
        (pBVar1->max_bandwidth_filter_).max_bandwidth_[0].bits_per_second_ = lVar4;
        (pBVar1->max_bandwidth_filter_).max_bandwidth_[1].bits_per_second_ = 0;
      }
      (this->cycle_).has_advanced_max_bw = true;
    }
    if ((this->last_cycle_stopped_risky_probe_ == true) &&
       (this->last_cycle_probed_too_high_ == false)) goto LAB_00118a65;
  }
  MaybeAdaptUpperBounds(this,congestion_event);
  bVar2 = IsTimeToProbeBandwidth(this,congestion_event);
  if (bVar2) {
LAB_00118a65:
    EnterProbeRefill(this,0,(QuicTime)(congestion_event->event_time).time_);
    return;
  }
  pBVar1 = (this->super_Bbr2ModeBase).model_;
  now.time_ = (congestion_event->event_time).time_;
  if ((pBVar1->min_rtt_filter_).min_rtt_.time_offset_ <
      now.time_ - (this->cycle_).phase_start_time.time_) {
LAB_00118a8e:
    EnterProbeCruise(this,now);
    return;
  }
  QVar3 = Bbr2NetworkModel::inflight_hi_with_headroom(pBVar1);
  if (prior_in_flight <= QVar3) {
    pBVar1 = (this->super_Bbr2ModeBase).model_;
    lVar4 = (pBVar1->max_bandwidth_filter_).max_bandwidth_[0].bits_per_second_;
    lVar5 = (pBVar1->max_bandwidth_filter_).max_bandwidth_[1].bits_per_second_;
    if (lVar5 < lVar4) {
      lVar5 = lVar4;
    }
    lVar5 = lVar5 * (pBVar1->min_rtt_filter_).min_rtt_.time_offset_;
    lVar4 = lVar5 + 7;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (prior_in_flight < (ulong)(lVar4 >> 3) / 1000000) {
      now.time_ = (congestion_event->event_time).time_;
      goto LAB_00118a8e;
    }
  }
  return;
}

Assistant:

void Bbr2ProbeBwMode::UpdateProbeDown(
    QuicByteCount prior_in_flight,
    const Bbr2CongestionEvent& congestion_event) {
  //DCHECK_EQ(cycle_.phase, CyclePhase::PROBE_DOWN);

  if (cycle_.rounds_in_phase == 1 && congestion_event.end_of_round_trip) {
    cycle_.is_sample_from_probing = false;

    if (!congestion_event.last_sample_is_app_limited) {
    /*  QUIC_DVLOG(2)
          << sender_
          << " Advancing max bw filter after one round in PROBE_DOWN.";*/
      model_->AdvanceMaxBandwidthFilter();
      cycle_.has_advanced_max_bw = true;
    }

    if (last_cycle_stopped_risky_probe_ && !last_cycle_probed_too_high_) {
      EnterProbeRefill(/*probe_up_rounds=*/0, congestion_event.event_time);
      return;
    }
  }

  MaybeAdaptUpperBounds(congestion_event);

  if (IsTimeToProbeBandwidth(congestion_event)) {
    EnterProbeRefill(/*probe_up_rounds=*/0, congestion_event.event_time);
    return;
  }

  if (HasStayedLongEnoughInProbeDown(congestion_event)) {
   // QUIC_DVLOG(3) << sender_ << " Proportional time based PROBE_DOWN exit";
    EnterProbeCruise(congestion_event.event_time);
    return;
  }

  const QuicByteCount inflight_with_headroom =
      model_->inflight_hi_with_headroom();
 /* QUIC_DVLOG(3)
      << sender_
      << " Checking if have enough inflight headroom. prior_in_flight:"
      << prior_in_flight
      << ", inflight_with_headroom:" << inflight_with_headroom;*/
  if (prior_in_flight > inflight_with_headroom) {
    // Stay in PROBE_DOWN.
    return;
  }

  // Transition to PROBE_CRUISE iff we've drained to target.
  QuicByteCount bdp = model_->BDP(model_->MaxBandwidth());
 /* QUIC_DVLOG(3) << sender_ << " Checking if drained to target. prior_in_flight:"
                << prior_in_flight << ", bdp:" << bdp;*/
  if (prior_in_flight < bdp) {
    EnterProbeCruise(congestion_event.event_time);
  }
}